

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMuxError MuxDeleteAllNamedData(WebPMux *mux,uint32_t tag)

{
  WebPChunkId id;
  WebPMuxError WVar1;
  WebPChunk **ppWVar2;
  WebPChunk *pWVar3;
  
  id = ChunkGetIdFromTag(tag);
  if ((id < WEBP_CHUNK_EXIF) && ((0x68U >> (id & 0x1f) & 1) != 0)) {
    WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    ppWVar2 = MuxGetChunkListFromId(mux,id);
    WVar1 = WEBP_MUX_NOT_FOUND;
    while( true ) {
      pWVar3 = *ppWVar2;
      if (pWVar3 == (WebPChunk *)0x0) break;
      if (pWVar3->tag_ == tag) {
        pWVar3 = ChunkDelete(pWVar3);
        *ppWVar2 = pWVar3;
        WVar1 = WEBP_MUX_OK;
      }
      else {
        ppWVar2 = &pWVar3->next_;
      }
    }
  }
  return WVar1;
}

Assistant:

static WebPMuxError MuxDeleteAllNamedData(WebPMux* const mux, uint32_t tag) {
  const WebPChunkId id = ChunkGetIdFromTag(tag);
  assert(mux != NULL);
  if (IsWPI(id)) return WEBP_MUX_INVALID_ARGUMENT;
  return DeleteChunks(MuxGetChunkListFromId(mux, id), tag);
}